

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O0

void lws_wsi_mux_sibling_disconnect(lws *wsi)

{
  lws *plVar1;
  lws_log_cx *cx;
  char *pcVar2;
  lws **local_20;
  lws **w;
  lws *wsi2;
  lws *wsi_local;
  
  local_20 = &(((wsi->mux).parent_wsi)->mux).child_list;
  do {
    if (*local_20 == (lws *)0x0) {
LAB_00124bf6:
      plVar1 = (wsi->mux).parent_wsi;
      (plVar1->mux).child_count = (plVar1->mux).child_count - 1;
      (wsi->mux).parent_wsi = (lws *)0x0;
      return;
    }
    if (*local_20 == wsi) {
      plVar1 = ((*local_20)->mux).sibling_list;
      ((*local_20)->mux).sibling_list = (lws *)0x0;
      *local_20 = plVar1;
      cx = lwsl_wsi_get_cx(wsi);
      pcVar2 = lws_wsi_tag(plVar1);
      _lws_log_cx(cx,lws_log_prepend_wsi,wsi,0x10,"lws_wsi_mux_sibling_disconnect",
                  " disentangled from sibling %s",pcVar2);
      goto LAB_00124bf6;
    }
    local_20 = &((*local_20)->mux).sibling_list;
  } while( true );
}

Assistant:

void
lws_wsi_mux_sibling_disconnect(struct lws *wsi)
{
	struct lws *wsi2;

	lws_start_foreach_llp(struct lws **, w,
			      wsi->mux.parent_wsi->mux.child_list) {

		/* disconnect from siblings */
		if (*w == wsi) {
			wsi2 = (*w)->mux.sibling_list;
			(*w)->mux.sibling_list = NULL;
			*w = wsi2;
			lwsl_wsi_debug(wsi, " disentangled from sibling %s",
					    lws_wsi_tag(wsi2));
			break;
		}
	} lws_end_foreach_llp(w, mux.sibling_list);
	wsi->mux.parent_wsi->mux.child_count--;

	wsi->mux.parent_wsi = NULL;
}